

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  Printer *pPVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  mapped_type *pmVar6;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *pcVar7;
  MessageOptions *this_00;
  int i_00;
  int i_01;
  undefined1 local_310 [8];
  DescriptorProto edp;
  string local_250;
  ExtensionRange *local_230;
  ExtensionRange *range;
  int i_2;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  string options_string;
  string descriptor_name;
  undefined1 local_170 [4];
  int i_1;
  string nested_name;
  char acStack_148 [4];
  int i;
  char required_function_arguments [91];
  allocator<char> local_c1;
  key_type local_c0;
  allocator<char> local_99;
  key_type local_98;
  undefined1 local_78 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string local_38;
  Descriptor *local_18;
  Descriptor *message_descriptor_local;
  Generator *this_local;
  
  local_18 = message_descriptor;
  message_descriptor_local = (Descriptor *)this;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar1 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_38,this,local_18);
  io::Printer::Print(pPVar1,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(this->printer_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_78);
  psVar5 = Descriptor::name_abi_cxx11_(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"name",&local_99);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_98);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  psVar5 = Descriptor::full_name_abi_cxx11_(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"full_name",&local_c1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(required_function_arguments + 0x58),"file",
             (allocator<char> *)(required_function_arguments + 0x57));
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,(key_type *)(required_function_arguments + 0x58));
  std::__cxx11::string::operator=((string *)pmVar6,"DESCRIPTOR");
  std::__cxx11::string::~string((string *)(required_function_arguments + 0x58));
  std::allocator<char>::~allocator((allocator<char> *)(required_function_arguments + 0x57));
  builtin_strncpy(required_function_arguments + 0x48,"ype=None,\n",0xb);
  builtin_strncpy(required_function_arguments + 0x38,"e$,\ncontaining_t",0x10);
  builtin_strncpy(required_function_arguments + 0x28,"=None,\nfile=$fil",0x10);
  builtin_strncpy(required_function_arguments + 0x18,"name$\',\nfilename",0x10);
  builtin_strncpy(required_function_arguments + 8,"ull_name=\'$full_",0x10);
  builtin_strncpy(acStack_148,"name",4);
  i._0_1_ = '=';
  i._1_1_ = '\'';
  i._2_1_ = '$';
  i._3_1_ = 'n';
  builtin_strncpy(required_function_arguments,"ame$\',\nf",8);
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_78,acStack_148);
  PrintFieldsInDescriptor(this,local_18);
  PrintExtensionsInDescriptor(this,local_18);
  io::Printer::Print(this->printer_,"nested_types=[");
  nested_name.field_2._12_4_ = 0;
  while( true ) {
    uVar2 = nested_name.field_2._12_4_;
    iVar3 = Descriptor::nested_type_count(local_18);
    if (iVar3 <= (int)uVar2) break;
    descriptor = Descriptor::nested_type(local_18,nested_name.field_2._12_4_);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)local_170,this,descriptor);
    io::Printer::Print(this->printer_,"$name$, ","name",(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    nested_name.field_2._12_4_ = nested_name.field_2._12_4_ + 1;
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  descriptor_name.field_2._12_4_ = 0;
  while( true ) {
    iVar3 = Descriptor::enum_type_count(local_18);
    if (iVar3 <= (int)descriptor_name.field_2._12_4_) break;
    descriptor_00 = Descriptor::enum_type(local_18,descriptor_name.field_2._12_4_);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((string *)((long)&options_string.field_2 + 8),this,descriptor_00);
    pPVar1 = this->printer_;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    io::Printer::Print(pPVar1,pcVar7);
    io::Printer::Print(this->printer_,",\n");
    std::__cxx11::string::~string((string *)(options_string.field_2._M_local_buf + 8));
    descriptor_name.field_2._12_4_ = descriptor_name.field_2._12_4_ + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  std::__cxx11::string::string((string *)local_1b8);
  this_00 = Descriptor::options(local_18);
  MessageLite::SerializeToString((MessageLite *)this_00,(string *)local_1b8);
  pPVar1 = this->printer_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"MessageOptions",&local_1f9);
  OptionsValue(&local_1d8,this,&local_1f8,(string *)local_1b8);
  iVar3 = Descriptor::extension_range_count(local_18);
  pcVar7 = "False";
  if (0 < iVar3) {
    pcVar7 = "True";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_2,pcVar7,(allocator<char> *)((long)&range + 7));
  io::Printer::Print(pPVar1,"options=$options_value$,\nis_extendable=$extendable$","options_value",
                     &local_1d8,"extendable",(string *)&i_2);
  std::__cxx11::string::~string((string *)&i_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&range + 7));
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  io::Printer::Print(this->printer_,",\n");
  io::Printer::Print(this->printer_,"extension_ranges=[");
  range._0_4_ = 0;
  while( true ) {
    iVar3 = (int)range;
    iVar4 = Descriptor::extension_range_count(local_18);
    if (iVar4 <= iVar3) break;
    local_230 = Descriptor::extension_range(local_18,(int)range);
    pPVar1 = this->printer_;
    SimpleItoa_abi_cxx11_(&local_250,(protobuf *)(ulong)(uint)local_230->start,i_00);
    SimpleItoa_abi_cxx11_((string *)&edp._cached_size_,(protobuf *)(ulong)(uint)local_230->end,i_01)
    ;
    io::Printer::Print(pPVar1,"($start$, $end$), ","start",&local_250,"end",
                       (string *)&edp._cached_size_);
    std::__cxx11::string::~string((string *)&edp._cached_size_);
    std::__cxx11::string::~string((string *)&local_250);
    range._0_4_ = (int)range + 1;
  }
  io::Printer::Print(this->printer_,"],\n");
  DescriptorProto::DescriptorProto((DescriptorProto *)local_310);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,local_18,(DescriptorProto *)local_310);
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,")\n");
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_310);
  std::__cxx11::string::~string((string *)local_1b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_78);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False");
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");

  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}